

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::uLessThan(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  Cell u2;
  Forth *this_local;
  
  requireDStackDepth(this,2,"U<");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (uVar2 < uVar1) {
    local_2c = this->True;
  }
  else {
    local_2c = this->False;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,local_2c);
  return;
}

Assistant:

void uLessThan() {
			REQUIRE_DSTACK_DEPTH(2, "U<");
			auto u2 = static_cast<Cell>(dStack.getTop()); pop();
			dStack.setTop(static_cast<Cell>(dStack.getTop()) < u2 ? True : False);
		}